

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::focusInEvent(QComboBox *this,QFocusEvent *e)

{
  QComboBoxPrivate *pQVar1;
  QCompleter *pQVar2;
  QCompleter *in_RSI;
  QWidget *in_RDI;
  QComboBoxPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  QWidget *widget;
  
  widget = in_RDI;
  pQVar1 = d_func((QComboBox *)0x53bf11);
  QWidget::update(in_stack_ffffffffffffffd8);
  if (pQVar1->lineEdit != (QLineEdit *)0x0) {
    (**(code **)(*(long *)&pQVar1->lineEdit->super_QWidget + 0x28))(pQVar1->lineEdit,in_RSI);
    pQVar2 = QLineEdit::completer((QLineEdit *)in_RDI);
    if (pQVar2 != (QCompleter *)0x0) {
      QLineEdit::completer((QLineEdit *)in_RDI);
      QCompleter::setWidget(in_RSI,widget);
    }
  }
  return;
}

Assistant:

void QComboBox::focusInEvent(QFocusEvent *e)
{
    Q_D(QComboBox);
    update();
    if (d->lineEdit) {
        d->lineEdit->event(e);
#if QT_CONFIG(completer)
        if (d->lineEdit->completer())
            d->lineEdit->completer()->setWidget(this);
#endif
    }
}